

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void SerializeMany<ParamsStream<DataStream&,TransactionSerParams>,COutPoint,CScript,unsigned_int>
               (ParamsStream<DataStream_&,_TransactionSerParams> *s,COutPoint *args,CScript *args_1,
               uint *args_2)

{
  long in_FS_OFFSET;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  SerializeMany<ParamsStream<DataStream&,TransactionSerParams>,transaction_identifier<false>,unsigned_int>
            (s,&args->hash,&args->n);
  SerializeMany<ParamsStream<DataStream&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
            (s,&args_1->super_CScriptBase);
  local_24 = *args_2;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
             (s->m_substream->vch).
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_24);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}